

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O2

bool __thiscall
Diligent::DearchiverBase::UnpackPSOShaders<Diligent::GraphicsPipelineStateCreateInfo>
          (DearchiverBase *this,ArchiveData *Archive,
          PSOData<Diligent::GraphicsPipelineStateCreateInfo> *PSO,IRenderDevice *pDevice)

{
  RefCntAutoPtr<Diligent::IShader> *this_00;
  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  *this_01;
  pointer pRVar1;
  bool bVar2;
  bool bVar3;
  DeviceType DevType;
  SerializedData *pSVar4;
  pointer pRVar5;
  char (*Args_1) [20];
  string *this_02;
  int iVar6;
  mutex *__m;
  ulong uVar7;
  ulong Idx;
  long local_168;
  Serializer<(Diligent::SerializerMode)0> Ser;
  Serializer<(Diligent::SerializerMode)0> ShaderSer;
  ShaderIndexArray ShaderIndices;
  string msg;
  DynamicLinearAllocator Allocator;
  
  if ((Archive->pObjArchive)._M_t.
      super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
      .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>._M_head_impl ==
      (DeviceObjectArchive *)0x0) {
    FormatString<char[26],char[12]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"pObjArchive",
               (char (*) [12])pDevice);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UnpackPSOShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x19d);
    std::__cxx11::string::~string((string *)&msg);
  }
  DevType = GetArchiveDeviceType(pDevice);
  pSVar4 = DeviceObjectArchive::GetDeviceSpecificData
                     ((Archive->pObjArchive)._M_t.
                      super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                      .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>.
                      _M_head_impl,GraphicsPipeline,
                      (PSO->CreateInfo).super_PipelineStateCreateInfo.PSODesc.
                      super_DeviceObjectAttribs.Name,DevType);
  if (pSVar4->m_Ptr == (void *)0x0) {
    bVar2 = false;
  }
  else {
    Allocator.m_pAllocator = GetRawAllocator();
    Allocator.m_Blocks.
    super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    Allocator.m_Blocks.
    super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    Allocator.m_Blocks.
    super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ShaderIndices.pIndices = (Uint32 *)0x0;
    Allocator.m_BlockSize = 0x1000;
    ShaderIndices.Count = 0;
    Ser.m_Start = (TPointer)pSVar4->m_Ptr;
    Ser.m_End = Ser.m_Start + pSVar4->m_Size;
    Ser.m_Ptr = Ser.m_Start;
    bVar2 = PSOSerializer<(Diligent::SerializerMode)0>::SerializeShaderIndices
                      (&Ser,&ShaderIndices,&Allocator);
    if (bVar2) {
      if (Ser.m_Ptr != Ser.m_End) {
        FormatString<char[49]>
                  (&msg,(char (*) [49])"No other data besides shader indices is expected");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"UnpackPSOShaders",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
                   ,0x1ad);
        std::__cxx11::string::~string((string *)&msg);
      }
      std::
      vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
      ::resize(&PSO->Shaders,(ulong)ShaderIndices.Count);
      __m = &(Archive->CachedShaders)._M_elems[DevType].Mtx;
      this_01 = &(Archive->CachedShaders)._M_elems[DevType].Shaders;
      local_168 = 0;
      for (uVar7 = 0; bVar2 = ShaderIndices.Count <= uVar7, !bVar2; uVar7 = uVar7 + 1) {
        pRVar5 = (PSO->Shaders).
                 super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        Idx = (ulong)ShaderIndices.pIndices[uVar7];
        std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&msg,__m);
        this_00 = (RefCntAutoPtr<Diligent::IShader> *)((long)&pRVar5->m_pObject + local_168);
        pRVar1 = (Archive->CachedShaders)._M_elems[DevType].Shaders.
                 super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((Idx < (ulong)((long)(Archive->CachedShaders)._M_elems[DevType].Shaders.
                                 super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3)) &&
           (RefCntAutoPtr<Diligent::IShader>::operator=(this_00,pRVar1 + Idx),
           pRVar5[uVar7].m_pObject != (IShader *)0x0)) {
          bVar3 = false;
          iVar6 = 0xe;
        }
        else {
          iVar6 = 0;
          bVar3 = true;
        }
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&msg);
        if (bVar3) {
          pSVar4 = DeviceObjectArchive::GetSerializedShader
                             ((Archive->pObjArchive)._M_t.
                              super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                              .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>.
                              _M_head_impl,DevType,Idx);
          if (pSVar4->m_Ptr == (void *)0x0) break;
          msg.field_2._M_allocated_capacity = 0;
          msg.field_2._8_8_ = 0;
          msg._M_dataplus._M_p = (pointer)0x0;
          msg._M_string_length = 0;
          Args_1 = (char (*) [20])pSVar4->m_Ptr;
          ShaderSer.m_End = (TPointer)(*Args_1 + pSVar4->m_Size);
          ShaderSer.m_Start = (TPointer)Args_1;
          ShaderSer.m_Ptr = (TPointer)Args_1;
          bVar3 = ShaderSerializer<(Diligent::SerializerMode)0>::SerializeCI
                            (&ShaderSer,(ConstQual<ShaderCreateInfo> *)&msg);
          if (!bVar3) {
            FormatString<char[84]>
                      ((string *)&Ser,
                       (char (*) [84])
                       "Failed to deserialize shader create info. Archive file may be corrupted or invalid."
                      );
            if (DebugMessageCallback != (undefined *)0x0) {
              (*(code *)DebugMessageCallback)(2,Ser.m_Start,0,0,0);
            }
            this_02 = (string *)&Ser;
            goto LAB_001fa5dc;
          }
          if (ShaderSer.m_Ptr != ShaderSer.m_End) {
            FormatString<char[26],char[20]>
                      ((string *)&Ser,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"ShaderSer.IsEnded()",Args_1);
            DebugAssertionFailed
                      ((Char *)Ser.m_Start,"UnpackPSOShaders",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
                       ,0x1d1);
            std::__cxx11::string::~string((string *)&Ser);
          }
          (*(this->super_ObjectBase<Diligent::IDearchiver>).
            super_RefCountedObject<Diligent::IDearchiver>.super_IDearchiver.super_IObject.
            _vptr_IObject[0xf])((string *)&Ser,this,&msg,pDevice);
          RefCntAutoPtr<Diligent::IShader>::operator=
                    (this_00,(RefCntAutoPtr<Diligent::IShader> *)&Ser);
          RefCntAutoPtr<Diligent::IShader>::Release((RefCntAutoPtr<Diligent::IShader> *)&Ser);
          if (pRVar5[uVar7].m_pObject == (IShader *)0x0) break;
          std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&msg,__m);
          pRVar5 = (Archive->CachedShaders)._M_elems[DevType].Shaders.
                   super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(Archive->CachedShaders)._M_elems[DevType].Shaders.
                            super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar5 >> 3) <= Idx)
          {
            std::
            vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
            ::resize(this_01,Idx + 1);
            pRVar5 = (this_01->
                     super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          }
          RefCntAutoPtr<Diligent::IShader>::operator=(pRVar5 + Idx,this_00);
          std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&msg);
        }
        else if ((iVar6 != 0xe) && (iVar6 != 0)) break;
        local_168 = local_168 + 8;
      }
    }
    else {
      FormatString<char[84]>
                (&msg,(char (*) [84])
                      "Failed to deserialize PSO shader indices. Archive file may be corrupted or invalid."
                );
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
      }
      this_02 = &msg;
LAB_001fa5dc:
      std::__cxx11::string::~string((string *)this_02);
      bVar2 = false;
    }
    DynamicLinearAllocator::~DynamicLinearAllocator(&Allocator);
  }
  return bVar2;
}

Assistant:

bool DearchiverBase::UnpackPSOShaders(ArchiveData&             Archive,
                                      PSOData<CreateInfoType>& PSO,
                                      IRenderDevice*           pDevice)
{
    const auto& pObjArchive = Archive.pObjArchive;
    VERIFY_EXPR(pObjArchive);
    const DeviceType      DevType       = GetArchiveDeviceType(pDevice);
    const SerializedData& ShaderIdxData = pObjArchive->GetDeviceSpecificData(PSO.ArchiveResType, PSO.CreateInfo.PSODesc.Name, DevType);
    if (!ShaderIdxData)
        return false;

    DynamicLinearAllocator Allocator{GetRawAllocator()};

    DeviceObjectArchive::ShaderIndexArray ShaderIndices;
    {
        Serializer<SerializerMode::Read> Ser{ShaderIdxData};
        if (!PSOSerializer<SerializerMode::Read>::SerializeShaderIndices(Ser, ShaderIndices, &Allocator))
        {
            LOG_ERROR_MESSAGE("Failed to deserialize PSO shader indices. Archive file may be corrupted or invalid.");
            return false;
        }
        VERIFY(Ser.IsEnded(), "No other data besides shader indices is expected");
    }

    ShaderCacheData& ShaderCache = Archive.CachedShaders[static_cast<size_t>(DevType)];

    PSO.Shaders.resize(ShaderIndices.Count);
    for (Uint32 i = 0; i < ShaderIndices.Count; ++i)
    {
        RefCntAutoPtr<IShader>& pShader{PSO.Shaders[i]};

        const Uint32 Idx = ShaderIndices.pIndices[i];

        {
            std::unique_lock<std::mutex> ReadLock{ShaderCache.Mtx};
            if (Idx < ShaderCache.Shaders.size())
            {
                // Try to get cached shader
                pShader = ShaderCache.Shaders[Idx];
                if (pShader)
                    continue;
            }
        }

        const SerializedData& SerializedShader = pObjArchive->GetSerializedShader(DevType, Idx);
        if (!SerializedShader)
            return false;

        {
            ShaderCreateInfo ShaderCI;
            {
                Serializer<SerializerMode::Read> ShaderSer{SerializedShader};
                if (!ShaderSerializer<SerializerMode::Read>::SerializeCI(ShaderSer, ShaderCI))
                {
                    LOG_ERROR_MESSAGE("Failed to deserialize shader create info. Archive file may be corrupted or invalid.");
                    return false;
                }
                VERIFY_EXPR(ShaderSer.IsEnded());
            }

            if ((PSO.InternalCI.Flags & PSO_CREATE_INTERNAL_FLAG_NO_SHADER_REFLECTION) != 0)
                ShaderCI.CompileFlags |= SHADER_COMPILE_FLAG_SKIP_REFLECTION;

            pShader = UnpackShader(ShaderCI, pDevice);
            if (!pShader)
                return false;
        }

        // Add to the cache
        {
            std::unique_lock<std::mutex> WriteLock{ShaderCache.Mtx};
            if (Idx >= ShaderCache.Shaders.size())
                ShaderCache.Shaders.resize(size_t{Idx} + 1);
            ShaderCache.Shaders[Idx] = pShader;
        }
    }

    return true;
}